

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IF97.h
# Opt level: O0

char IF97::Region3Backwards::BackwardsRegion3SubRegionDetermination(double T,double p)

{
  out_of_range *this;
  double dVar1;
  double p_local;
  double T_local;
  
  if (22.5 < p) {
    this = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this,"Out of range");
    __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  if ((p <= 22.11) || (22.5 < p)) {
    if ((p <= 22.064) || (22.11 < p)) {
      dVar1 = Tsat97(p);
      if (dVar1 < T) {
        if ((p <= 21.90096265) || (22.064 < p)) {
          T_local._7_1_ = 'X';
        }
        else {
          dVar1 = DividingLine(LINE_WX,p);
          if (dVar1 < T) {
            dVar1 = DividingLine(LINE_WX,p);
            if ((dVar1 < T) && (dVar1 = DividingLine(LINE_RX,p), T <= dVar1)) {
              return 'X';
            }
            T_local._7_1_ = '?';
          }
          else {
            T_local._7_1_ = 'Z';
          }
        }
      }
      else if ((p <= 21.93161551) || (22.064 < p)) {
        T_local._7_1_ = 'U';
      }
      else {
        dVar1 = DividingLine(LINE_QU,p);
        if ((dVar1 < T) && (dVar1 = DividingLine(LINE_UV,p), T <= dVar1)) {
          return 'U';
        }
        dVar1 = DividingLine(LINE_UV,p);
        if (T <= dVar1) {
          T_local._7_1_ = '?';
        }
        else {
          T_local._7_1_ = 'Y';
        }
      }
    }
    else {
      dVar1 = DividingLine(LINE_QU,p);
      if ((dVar1 < T) && (dVar1 = DividingLine(LINE_UV,p), T <= dVar1)) {
        return 'U';
      }
      dVar1 = DividingLine(LINE_UV,p);
      if ((dVar1 < T) && (dVar1 = DividingLine(LINE_EF,p), T <= dVar1)) {
        return 'Y';
      }
      dVar1 = DividingLine(LINE_EF,p);
      if ((dVar1 < T) && (dVar1 = DividingLine(LINE_WX,p), T <= dVar1)) {
        return 'Z';
      }
      dVar1 = DividingLine(LINE_WX,p);
      if ((dVar1 < T) && (dVar1 = DividingLine(LINE_RX,p), T <= dVar1)) {
        return 'X';
      }
      T_local._7_1_ = '?';
    }
  }
  else {
    dVar1 = DividingLine(LINE_QU,p);
    if ((dVar1 < T) && (dVar1 = DividingLine(LINE_UV,p), T <= dVar1)) {
      return 'U';
    }
    dVar1 = DividingLine(LINE_UV,p);
    if ((dVar1 < T) && (dVar1 = DividingLine(LINE_EF,p), T <= dVar1)) {
      return 'V';
    }
    dVar1 = DividingLine(LINE_EF,p);
    if ((dVar1 < T) && (dVar1 = DividingLine(LINE_WX,p), T <= dVar1)) {
      return 'W';
    }
    dVar1 = DividingLine(LINE_WX,p);
    if ((dVar1 < T) && (dVar1 = DividingLine(LINE_RX,p), T <= dVar1)) {
      return 'X';
    }
    T_local._7_1_ = '?';
  }
  return T_local._7_1_;
}

Assistant:

inline char BackwardsRegion3SubRegionDetermination(double T, double p){

            if (p > 22.5*p_fact){
               throw std::out_of_range("Out of range");
            }
            else if (22.11*p_fact < p && p <= 22.5*p_fact){
                // Supercritical
                if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                else if (DividingLine(LINE_UV, p) < T && T <= DividingLine(LINE_EF, p)){ return 'V';}
                else if (DividingLine(LINE_EF, p) < T && T <= DividingLine(LINE_WX, p)){ return 'W';}
                else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                else {return '?';}
            }
            else if (22.064*p_fact < p && p <= 22.11*p_fact){
                // Supercritical
                if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                else if (DividingLine(LINE_UV, p) < T && T <= DividingLine(LINE_EF, p)){ return 'Y';}
                else if (DividingLine(LINE_EF, p) < T && T <= DividingLine(LINE_WX, p)){ return 'Z';}
                else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                else {return '?';}
            }
            else if (T <= Tsat97(p)){
                if (21.93161551*p_fact < p && p <= 22.064*p_fact){
                    // Sub-critical
                    if (DividingLine(LINE_QU, p) < T && T <= DividingLine(LINE_UV, p)){ return 'U';}
                    else if (DividingLine(LINE_UV, p) < T ){ return 'Y';}
                    else {return '?';}
                }
                else{
                    return 'U';
                }
            }
            else{
                if (21.90096265*p_fact < p && p <= 22.064*p_fact){
                    // Sub-critical
                    if (T <= DividingLine(LINE_WX, p)){ return 'Z';}
                    else if (DividingLine(LINE_WX, p) < T && T <= DividingLine(LINE_RX, p)){ return 'X';}
                    else {return '?';}
                }
                else{
                    return 'X';
                }
            }
        }